

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O3

int close_filters(archive_read *a)

{
  archive_read *paVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  
  if (a == (archive_read *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      paVar1 = *(archive_read **)&(a->archive).archive_format;
      if ((*(char *)((long)&a->skip_file_set + 1) == '\0') &&
         (pcVar2 = (code *)(a->archive).error_string.s, pcVar2 != (code *)0x0)) {
        iVar3 = (*pcVar2)(a);
        *(undefined1 *)((long)&a->skip_file_set + 1) = 1;
        if (iVar3 < iVar4) {
          iVar4 = iVar3;
        }
      }
      free((a->archive).sconv);
      (a->archive).sconv = (archive_string_conv *)0x0;
      a = paVar1;
    } while (paVar1 != (archive_read *)0x0);
  }
  return iVar4;
}

Assistant:

static int
close_filters(struct archive_read *a)
{
	struct archive_read_filter *f = a->filter;
	int r = ARCHIVE_OK;
	/* Close each filter in the pipeline. */
	while (f != NULL) {
		struct archive_read_filter *t = f->upstream;
		if (!f->closed && f->close != NULL) {
			int r1 = (f->close)(f);
			f->closed = 1;
			if (r1 < r)
				r = r1;
		}
		free(f->buffer);
		f->buffer = NULL;
		f = t;
	}
	return r;
}